

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void nn_append_string(nn_parse_context *ctx,nn_option *opt,char *str)

{
  int iVar1;
  bool bVar2;
  void *pvVar3;
  size_t sVar4;
  ushort **ppuVar5;
  uint uVar6;
  FILE *__stream;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar7;
  void *pvVar8;
  
  pvVar8 = ctx->target;
  lVar7 = (long)(int)opt;
  if (*(void **)((long)pvVar8 + lVar7) == (void *)0x0) {
    pvVar3 = malloc(8);
    *(undefined4 *)((long)pvVar8 + lVar7 + 0x10) = 1;
  }
  else {
    iVar1 = *(int *)((long)pvVar8 + lVar7 + 0x10);
    *(int *)((long)pvVar8 + lVar7 + 0x10) = iVar1 + 1;
    opt = (nn_option *)((long)iVar1 * 8 + 8);
    pvVar3 = realloc(*(void **)((long)pvVar8 + lVar7),(size_t)opt);
  }
  *(void **)((long)pvVar8 + lVar7) = pvVar3;
  if (pvVar3 == (void *)0x0) {
    __stream = (FILE *)ctx;
    nn_append_string_cold_1();
    sVar4 = strlen((char *)opt);
    if (0x37 < sVar4) {
      ppuVar5 = __ctype_b_loc();
      uVar6 = 0x38;
      do {
        if ((*(byte *)((long)*ppuVar5 + (long)*(char *)((long)&opt->longname + (ulong)uVar6) * 2 + 1
                      ) & 0x20) != 0) {
          fprintf(__stream,"%.*s",(ulong)uVar6,opt,in_R8,in_R9,str,ctx,pvVar8);
          return;
        }
        bVar2 = 2 < uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar2);
    }
    fputs((char *)opt,__stream);
    return;
  }
  *(char **)((long)pvVar3 + (long)*(int *)((long)pvVar8 + lVar7 + 0x10) * 8 + -8) = str;
  return;
}

Assistant:

static void nn_append_string (struct nn_parse_context *ctx,
                             struct nn_option *opt, char *str)
{
    struct nn_string_list *lst;

    lst = (struct nn_string_list *)(
        ((char *)ctx->target) + opt->offset);
    if (lst->items) {
        lst->num += 1;
        lst->items = realloc (lst->items, sizeof (char *) * lst->num);
    } else {
        lst->items = malloc (sizeof (char *));
        lst->num = 1;
    }
    if (!lst->items) {
        nn_memory_error (ctx);
    }
    lst->items[lst->num-1] = str;
}